

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaPResCompAttrErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlSchemaBasicItemPtr ownerItem,
               xmlNodePtr ownerElem,char *name,xmlChar *refName,xmlChar *refURI,
               xmlSchemaTypeType refType,char *refTypeStr)

{
  xmlChar *str1;
  xmlChar *str2;
  char *node;
  xmlParserErrors code;
  xmlSchemaParserCtxtPtr ctxt_00;
  xmlChar *str3;
  xmlChar *local_58;
  xmlChar *strA;
  xmlChar *des;
  xmlChar *refName_local;
  char *name_local;
  xmlNodePtr ownerElem_local;
  xmlSchemaBasicItemPtr ownerItem_local;
  xmlSchemaParserCtxtPtr pxStack_20;
  xmlParserErrors error_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  strA = (xmlChar *)0x0;
  local_58 = (xmlChar *)0x0;
  des = refName;
  refName_local = (xmlChar *)name;
  name_local = (char *)ownerElem;
  ownerElem_local = (xmlNodePtr)ownerItem;
  ownerItem_local._4_4_ = error;
  pxStack_20 = ctxt;
  xmlSchemaFormatItemForReport(&strA,(xmlChar *)0x0,ownerItem,ownerElem);
  if (refTypeStr == (char *)0x0) {
    refTypeStr = (char *)xmlSchemaItemTypeToStr(refType);
  }
  ctxt_00 = pxStack_20;
  code = ownerItem_local._4_4_;
  node = name_local;
  str2 = refName_local;
  str1 = strA;
  str3 = xmlSchemaFormatQName(&local_58,refURI,des);
  xmlSchemaPErrExt(ctxt_00,(xmlNodePtr)node,code,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,
                   "%s, attribute \'%s\': The QName value \'%s\' does not resolve to a(n) %s.\n",
                   str1,str2,str3,(xmlChar *)refTypeStr,(xmlChar *)0x0);
  if (strA != (xmlChar *)0x0) {
    (*xmlFree)(strA);
    strA = (xmlChar *)0x0;
  }
  if (local_58 != (xmlChar *)0x0) {
    (*xmlFree)(local_58);
  }
  return;
}

Assistant:

static void
xmlSchemaPResCompAttrErr(xmlSchemaParserCtxtPtr ctxt,
			 xmlParserErrors error,
			 xmlSchemaBasicItemPtr ownerItem,
			 xmlNodePtr ownerElem,
			 const char *name,
			 const xmlChar *refName,
			 const xmlChar *refURI,
			 xmlSchemaTypeType refType,
			 const char *refTypeStr)
{
    xmlChar *des = NULL, *strA = NULL;

    xmlSchemaFormatItemForReport(&des, NULL, ownerItem, ownerElem);
    if (refTypeStr == NULL)
	refTypeStr = (const char *) xmlSchemaItemTypeToStr(refType);
    xmlSchemaPErrExt(ctxt, ownerElem, error,
	    NULL, NULL, NULL,
	    "%s, attribute '%s': The QName value '%s' does not resolve to a(n) "
	    "%s.\n", BAD_CAST des, BAD_CAST name,
	    xmlSchemaFormatQName(&strA, refURI, refName),
	    BAD_CAST refTypeStr, NULL);
    FREE_AND_NULL(des)
    FREE_AND_NULL(strA)
}